

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O1

void oonf_rfc5444_remove_target(oonf_rfc5444_target *target)

{
  undefined8 uVar1;
  ulong uVar2;
  netaddr_str nbuf;
  
  uVar2 = (ulong)_oonf_rfc5444_subsystem.logging;
  if (((&log_global_mask)[uVar2] & 2) != 0) {
    uVar1 = netaddr_to_prefixstring(&nbuf,&target->dst,0);
    oonf_log(2,uVar2,"src/base/oonf_rfc5444.c",0x354,0,0,
             "Remove target %s from interface %s on protocol %s (refcount was %d)",uVar1,
             target->interface,target->interface->protocol,target->_refcount);
  }
  if (target->_refcount < 2) {
    avl_remove(&target->interface->_target_tree);
    oonf_rfc5444_remove_interface(target->interface,(oonf_rfc5444_interface_listener *)0x0);
    _destroy_target(target);
  }
  else {
    target->_refcount = target->_refcount + -1;
  }
  return;
}

Assistant:

void
oonf_rfc5444_remove_target(struct oonf_rfc5444_target *target) {
#ifdef OONF_LOG_INFO
  struct netaddr_str nbuf;
#endif

  OONF_INFO(LOG_RFC5444, "Remove target %s from interface %s on protocol %s (refcount was %d)",
    netaddr_to_string(&nbuf, &target->dst), target->interface->name, target->interface->protocol->name,
    target->_refcount);

  if (target->_refcount > 1) {
    /* target still in use */
    target->_refcount--;
    return;
  }

  /* remove from protocol tree */
  avl_remove(&target->interface->_target_tree, &target->_node);

  /* decrease protocol refcount */
  oonf_rfc5444_remove_interface(target->interface, NULL);

  /* remove target */
  _destroy_target(target);
}